

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::SetShortcutRouting(ImGuiKeyChord key_chord,ImGuiID owner_id,ImGuiInputFlags flags)

{
  int iVar1;
  ImGuiID IVar2;
  ImGuiKeyRoutingData *pIVar3;
  uint in_EDX;
  ImGuiID in_ESI;
  ImGuiID routing_id;
  ImGuiKeyRoutingData *routing_data;
  int score;
  ImGuiContext *g;
  uint local_10;
  bool local_1;
  
  local_10 = in_EDX;
  if ((in_EDX & 0xf00) == 0) {
    local_10 = in_EDX | 0x800;
  }
  if (((local_10 & 0x2000) == 0) || (GImGui->NavWindow != (ImGuiWindow *)0x0)) {
    if ((local_10 & 0x1000) == 0) {
      iVar1 = CalcRoutingScore(GImGui->CurrentWindow,in_ESI,local_10);
      if (iVar1 == 0xff) {
        local_1 = false;
      }
      else {
        pIVar3 = GetShortcutRoutingData(routing_id);
        IVar2 = GetRoutingIdFromOwnerId(in_ESI);
        if (iVar1 < (int)(uint)pIVar3->RoutingNextScore) {
          pIVar3->RoutingNext = IVar2;
          pIVar3->RoutingNextScore = (ImU8)iVar1;
        }
        local_1 = pIVar3->RoutingCurr == IVar2;
      }
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::SetShortcutRouting(ImGuiKeyChord key_chord, ImGuiID owner_id, ImGuiInputFlags flags)
{
    ImGuiContext& g = *GImGui;
    if ((flags & ImGuiInputFlags_RouteMask_) == 0)
        flags |= ImGuiInputFlags_RouteGlobalHigh; // IMPORTANT: This is the default for SetShortcutRouting() but NOT Shortcut()
    else
        IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiInputFlags_RouteMask_)); // Check that only 1 routing flag is used

    if (flags & ImGuiInputFlags_RouteUnlessBgFocused)
        if (g.NavWindow == NULL)
            return false;
    if (flags & ImGuiInputFlags_RouteAlways)
        return true;

    const int score = CalcRoutingScore(g.CurrentWindow, owner_id, flags);
    if (score == 255)
        return false;

    // Submit routing for NEXT frame (assuming score is sufficient)
    // FIXME: Could expose a way to use a "serve last" policy for same score resolution (using <= instead of <).
    ImGuiKeyRoutingData* routing_data = GetShortcutRoutingData(key_chord);
    const ImGuiID routing_id = GetRoutingIdFromOwnerId(owner_id);
    //const bool set_route = (flags & ImGuiInputFlags_ServeLast) ? (score <= routing_data->RoutingNextScore) : (score < routing_data->RoutingNextScore);
    if (score < routing_data->RoutingNextScore)
    {
        routing_data->RoutingNext = routing_id;
        routing_data->RoutingNextScore = (ImU8)score;
    }

    // Return routing state for CURRENT frame
    return routing_data->RoutingCurr == routing_id;
}